

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign.hpp
# Opt level: O2

void remora::kernels::detail::
     matrix_assign<remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::row_major,remora::dense_tag,remora::dense_tag,remora::cpu_tag>
               (void)

{
  type transE;
  type transM;
  
  bindings::
  matrix_assign<remora::dense_matrix_adaptor<double,remora::row_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double_const,remora::column_major,remora::continuous_dense_tag,remora::cpu_tag>>
            ();
  return;
}

Assistant:

void matrix_assign(
	matrix_expression<M, Device>& m, 
	matrix_expression<E, Device> const& e,
	column_major, EOrientation,TagE tagE, TagM tagM
) {
	typedef typename M::orientation::transposed_orientation::orientation TMOrientation;
	typedef typename E::orientation::transposed_orientation::orientation TEOrientation;
	auto transM = trans(m);
	auto transE = trans(e);
	//dispatch to first version
	matrix_assign(transM, transE, TMOrientation(), TEOrientation(), tagE, tagM);
}